

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unitary_tests_utils.h
# Opt level: O3

void GUDHI_TEST_FLOAT_EQUALITY_CHECK<float>(float a,float b,float epsilon)

{
  shared_count sStack_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  undefined **local_30;
  undefined1 local_28;
  undefined8 *local_20;
  char **local_18;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Unitary_tests_utils.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1a);
  sStack_78.pi_ = (sp_counted_base *)0x0;
  local_18 = &local_60;
  local_60 = "std::fabs(a - b) <= epsilon";
  local_58 = "";
  local_28 = 0;
  local_30 = &PTR__lazy_ostream_0016e738;
  local_20 = &boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Unitary_tests_utils.h"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_78);
  return;
}

Assistant:

void GUDHI_TEST_FLOAT_EQUALITY_CHECK(FloatingType a, FloatingType b,
                                     FloatingType epsilon = std::numeric_limits<FloatingType>::epsilon()) {
#ifdef DEBUG_TRACES
  std::clog << "GUDHI_TEST_FLOAT_EQUALITY_CHECK - " << a << " versus " << b
            << " | diff = " << std::fabs(a - b) << " - epsilon = " << epsilon << std::endl;
#endif
  BOOST_CHECK(std::fabs(a - b) <= epsilon);
}